

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O1

void __thiscall
minibag::Bag::readHeaderFromBuffer
          (Bag *this,Buffer *buffer,uint32_t offset,Header *header,uint32_t *data_size,
          uint32_t *bytes_read)

{
  uint uVar1;
  char cVar2;
  uint8_t *puVar3;
  runtime_error *this_00;
  uint uVar4;
  string error_msg;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar3 = Buffer::getData(buffer);
  uVar4 = (int)(puVar3 + offset) + 4;
  uVar1 = *(uint *)(puVar3 + offset);
  cVar2 = miniros::Header::parse((uchar *)header,uVar4,(string *)(ulong)uVar1);
  if (cVar2 == '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Error parsing header","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_00150718;
    __cxa_throw(this_00,&BagFormatException::typeinfo,std::runtime_error::~runtime_error);
  }
  *data_size = *(uint32_t *)(puVar3 + offset + 4 + (long)(ulong)uVar1);
  *bytes_read = ((uVar4 + uVar1) - (int)(puVar3 + offset)) + 4;
  return;
}

Assistant:

void Bag::readHeaderFromBuffer(Buffer& buffer, uint32_t offset, miniros::Header& header, uint32_t& data_size, uint32_t& bytes_read) const {
    assert(buffer.getSize() > 8);

    uint8_t* start = (uint8_t*) buffer.getData() + offset;

    uint8_t* ptr = start;

    // Read the header length
    uint32_t header_len;
    memcpy(&header_len, ptr, 4);
    ptr += 4;

    // Parse the header
    string error_msg;
    bool parsed = header.parse(ptr, header_len, error_msg);
    if (!parsed)
        throw BagFormatException("Error parsing header");
    ptr += header_len;

    // Read the data size
    memcpy(&data_size, ptr, 4);
    ptr += 4;

    bytes_read = ptr - start;
}